

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

int whisper_wrap_segment(whisper_context *ctx,whisper_state *state,int max_len,bool split_on_word)

{
  int64_t iVar1;
  __normal_iterator<whisper_token_data_*,_std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>_>
  __first;
  undefined1 uVar2;
  whisper_token wVar3;
  size_type sVar4;
  __normal_iterator<whisper_token_data_*,_std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>_>
  __last;
  size_t sVar5;
  reference pvVar6;
  byte in_CL;
  int in_EDX;
  whisper_context *in_RDI;
  int cur;
  char *txt;
  value_type *token;
  int i;
  string text;
  int acc;
  int res;
  value_type segment;
  undefined4 in_stack_fffffffffffffe58;
  whisper_token in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  int iVar7;
  undefined4 in_stack_fffffffffffffe64;
  __normal_iterator<whisper_token_data_*,_std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>_>
  *this;
  whisper_segment *in_stack_fffffffffffffe78;
  whisper_segment *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffea0;
  whisper_token wVar8;
  iterator in_stack_fffffffffffffeb8;
  string local_108 [32];
  undefined4 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  int local_c0;
  whisper_token_data *local_b0;
  reference local_a8;
  int local_9c;
  string local_98 [32];
  int local_78;
  int local_74;
  int64_t local_68;
  undefined1 local_38 [56];
  
  local_38[0x23] = in_CL & 1;
  local_38._36_4_ = in_EDX;
  local_38._48_8_ = in_RDI;
  std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
            ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  whisper_segment::whisper_segment(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_74 = 1;
  local_78 = 0;
  std::__cxx11::string::string(local_98);
  local_9c = 0;
  while (iVar7 = local_9c,
        sVar4 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::size
                          ((vector<whisper_token_data,_std::allocator<whisper_token_data>_> *)
                           local_38), iVar7 < (int)sVar4) {
    local_a8 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                         ((vector<whisper_token_data,_std::allocator<whisper_token_data>_> *)
                          local_38,(long)local_9c);
    wVar8 = local_a8->id;
    wVar3 = whisper_token_eot((whisper_context *)local_38._48_8_);
    if (wVar8 < wVar3) {
      __last._M_current =
           (whisper_token_data *)
           whisper_token_to_str
                     ((whisper_context *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      in_stack_fffffffffffffe5c);
      local_b0 = __last._M_current;
      sVar5 = strlen((char *)__last._M_current);
      local_c0 = (int)sVar5;
      if ((((int)local_38._36_4_ < local_78 + local_c0) && (0 < local_9c)) &&
         (uVar2 = should_split_on_word((char *)local_b0,(bool)(local_38[0x23] & 1)), (bool)uVar2)) {
        pvVar6 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                           ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        std::__cxx11::string::operator=((string *)&pvVar6->text,local_98);
        iVar1 = local_a8->t0;
        pvVar6 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                           ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        pvVar6->t1 = iVar1;
        std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                  ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::resize
                  ((vector<whisper_token_data,_std::allocator<whisper_token_data>_> *)
                   in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        pvVar6 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                           ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        pvVar6->speaker_turn_next = false;
        std::__cxx11::string::string(local_108);
        local_e8 = 0;
        local_e0 = 0;
        uStack_d8 = 0;
        local_d0 = 0;
        std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::vector
                  ((vector<whisper_token_data,_std::allocator<whisper_token_data>_> *)0x1fd1b3);
        local_c8 = 0;
        std::vector<whisper_segment,_std::allocator<whisper_segment>_>::push_back
                  ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (value_type *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        whisper_segment::~whisper_segment
                  ((whisper_segment *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60))
        ;
        this = (__normal_iterator<whisper_token_data_*,_std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>_>
                *)local_a8->t0;
        pvVar6 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                           ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        iVar1 = local_68;
        pvVar6->t0 = (int64_t)this;
        pvVar6 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                           ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        pvVar6->t1 = iVar1;
        pvVar6 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                           ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        in_stack_fffffffffffffe80 = (whisper_segment *)&pvVar6->tokens;
        std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                  ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::end
                  ((vector<whisper_token_data,_std::allocator<whisper_token_data>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        __gnu_cxx::
        __normal_iterator<whisper_token_data_const*,std::vector<whisper_token_data,std::allocator<whisper_token_data>>>
        ::__normal_iterator<whisper_token_data*>
                  ((__normal_iterator<const_whisper_token_data_*,_std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (__normal_iterator<whisper_token_data_*,_std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        in_stack_fffffffffffffe78 = (whisper_segment *)local_38;
        std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::begin
                  ((vector<whisper_token_data,_std::allocator<whisper_token_data>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        __gnu_cxx::
        __normal_iterator<whisper_token_data_*,_std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>_>
        ::operator+(this,CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::end
                  ((vector<whisper_token_data,_std::allocator<whisper_token_data>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        __first._M_current._4_4_ = iVar7;
        __first._M_current._0_4_ = wVar8;
        in_stack_fffffffffffffeb8 =
             std::vector<whisper_token_data,std::allocator<whisper_token_data>>::
             insert<__gnu_cxx::__normal_iterator<whisper_token_data*,std::vector<whisper_token_data,std::allocator<whisper_token_data>>>,void>
                       ((vector<whisper_token_data,_std::allocator<whisper_token_data>_> *)
                        CONCAT17(uVar2,in_stack_fffffffffffffea0),
                        in_stack_fffffffffffffeb8._M_current,__first,__last);
        in_stack_fffffffffffffe64 = CONCAT13(local_38[0x18],(int3)in_stack_fffffffffffffe64);
        pvVar6 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                           ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        pvVar6->speaker_turn_next = (bool)((byte)((uint)in_stack_fffffffffffffe64 >> 0x18) & 1);
        local_78 = 0;
        std::__cxx11::string::operator=(local_98,"");
        std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                  ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        whisper_segment::operator=
                  ((whisper_segment *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (whisper_segment *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
        ;
        local_9c = -1;
        local_74 = local_74 + 1;
      }
      else {
        local_78 = local_78 + local_c0;
        std::__cxx11::string::operator+=(local_98,(char *)local_b0);
      }
    }
    local_9c = local_9c + 1;
  }
  pvVar6 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::back
                     ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::__cxx11::string::operator=((string *)&pvVar6->text,local_98);
  iVar7 = local_74;
  std::__cxx11::string::~string(local_98);
  whisper_segment::~whisper_segment((whisper_segment *)CONCAT44(in_stack_fffffffffffffe64,iVar7));
  return iVar7;
}

Assistant:

static int whisper_wrap_segment(struct whisper_context & ctx, struct whisper_state & state, int max_len, bool split_on_word) {
    auto segment = state.result_all.back();

    int res = 1;
    int acc = 0;

    std::string text;

    for (int i = 0; i < (int) segment.tokens.size(); i++) {
        const auto & token = segment.tokens[i];
        if (token.id >= whisper_token_eot(&ctx)) {
            continue;
        }

        const auto txt = whisper_token_to_str(&ctx, token.id);
        const int cur = strlen(txt);

        if (acc + cur > max_len && i > 0 && should_split_on_word(txt, split_on_word)) {
            state.result_all.back().text = std::move(text);
            state.result_all.back().t1 = token.t0;
            state.result_all.back().tokens.resize(i);
            state.result_all.back().speaker_turn_next = false;

            state.result_all.push_back({});
            state.result_all.back().t0 = token.t0;
            state.result_all.back().t1 = segment.t1;

            // add tokens [i, end] to the new segment
            state.result_all.back().tokens.insert(
                state.result_all.back().tokens.end(),
                    segment.tokens.begin() + i,
                    segment.tokens.end());

            state.result_all.back().speaker_turn_next = segment.speaker_turn_next;

            acc = 0;
            text = "";

            segment = state.result_all.back();
            i = -1;

            res++;
        } else {
            acc += cur;
            text += txt;
        }
    }

    state.result_all.back().text = std::move(text);

    return res;
}